

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_indirect_string.cpp
# Opt level: O2

void __thiscall
IndirectStringAdder_NewString_Test::~IndirectStringAdder_NewString_Test
          (IndirectStringAdder_NewString_Test *this)

{
  anon_unknown.dwarf_1f9e83::IndirectStringAdder::~IndirectStringAdder
            (&this->super_IndirectStringAdder);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (IndirectStringAdder, NewString) {
    constexpr auto str = "string";
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        {
            auto const name_index = pstore::index::get_index<pstore::trailer::indices::name> (db_);

            // Use the string adder to insert a string into the index and flush it to the store.
            pstore::indirect_string_adder adder;
            auto const sstring1 = pstore::make_sstring_view (str);
            auto const sstring2 = pstore::make_sstring_view (str);
            {
                std::pair<pstore::index::name_index::iterator, bool> res1 =
                    adder.add (transaction, name_index, &sstring1);
                pstore::shared_sstring_view res1_owner;
                EXPECT_EQ (res1.first->as_string_view (&res1_owner), sstring1);
                EXPECT_TRUE (res1.second);
            }
            {
                // adding the same string again should result in nothing being written.
                std::pair<pstore::index::name_index::iterator, bool> const res2 =
                    adder.add (transaction, name_index, &sstring2);

                pstore::shared_sstring_view res2_owner;
                EXPECT_EQ (res2.first->as_string_view (&res2_owner), sstring1);
                EXPECT_FALSE (res2.second);
            }
            EXPECT_EQ (transaction.size (), sizeof (pstore::address));
            adder.flush (transaction);
        }
        transaction.commit ();
    }
    {
        auto const name_index = pstore::index::get_index<pstore::trailer::indices::name> (db_);
        auto const sstring = pstore::make_sstring_view (str);
        auto const pos = name_index->find (db_, pstore::indirect_string{db_, &sstring});
        ASSERT_NE (pos, name_index->cend (db_));

        pstore::shared_sstring_view owner;
        EXPECT_EQ (pos->as_string_view (&owner), pstore::make_sstring_view (str));
    }
}